

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O0

void __thiscall shared_ptr_stat_pointer_cast_Test::TestBody(shared_ptr_stat_pointer_cast_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  char *pcVar3;
  A *pAVar4;
  B *this_01;
  long in_FS_OFFSET;
  shared_ptr_stat_pointer_cast_Test *this_local;
  Message local_698;
  int local_68c;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_36;
  Message local_670;
  int local_664;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_35;
  Message local_648;
  A *local_640;
  void *local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_34;
  Message local_618;
  long local_610;
  undefined4 local_604;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_33;
  Message local_5e8;
  bool local_5da;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_32;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_31;
  Message local_598;
  int local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_30;
  Message local_570;
  int local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_29;
  Message local_548;
  A *local_540;
  void *local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_28;
  Message local_518;
  long local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_27;
  Message local_4e8;
  bool local_4da;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_26;
  Message local_4c0;
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_25;
  Message local_498;
  long local_490;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_24;
  AssertHelper local_460;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_23;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_22;
  Message local_408;
  A *local_400;
  void *local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_21;
  Message local_3d8;
  long local_3d0;
  int local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_20;
  Message local_3a8;
  bool local_39a;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_19;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_18;
  shared_ptr<A> a2Ptr;
  Message local_348;
  int local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_17;
  Message local_320;
  int local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_16;
  Message local_2f8;
  B *local_2f0;
  void *local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_15;
  Message local_2c8;
  long local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_14;
  Message local_298;
  bool local_28a;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_13;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_12;
  shared_ptr<B> bPtr;
  Message local_238;
  int local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_11;
  Message local_210;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_10;
  Message local_1e8;
  A *local_1e0;
  void *local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_9;
  Message local_1b8;
  long local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_8;
  Message local_188;
  bool local_17a;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_7;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  shared_ptr<A> abPtr;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  A *local_f8;
  void *local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  Message local_d0;
  long local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  bool local_92;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<A> aPtr;
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  shared_ptr<A> a0Ptr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  shared_ptr<A>::shared_ptr((shared_ptr<A> *)&gtest_ar.message_);
  local_31 = false;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_30,"false","a0Ptr",&local_31,
             (shared_ptr<A> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&aPtr.px,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x215,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&aPtr.px,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&aPtr.px);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  pAVar4 = (A *)operator_new(8);
  A::A(pAVar4);
  shared_ptr<A>::shared_ptr((shared_ptr<A> *)&gtest_ar_1.message_,pAVar4);
  local_69 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_68,"true","aPtr",&local_69,
             (shared_ptr<A> *)&gtest_ar_1.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x219,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_91 = true;
  local_92 = shared_ptr<A>::unique((shared_ptr<A> *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_90,"true","aPtr.unique()",&local_91,&local_92);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_bc = 1;
  local_c8 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_b8,"1","aPtr.use_count()",&local_bc,&local_c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = (void *)0x0;
  local_f8 = shared_ptr<A>::get((shared_ptr<A> *)&gtest_ar_1.message_);
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)local_e8,"(void*)__null","aPtr.get()",&local_f0,&local_f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_11c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_118,"1","A::_mNbInstances",&local_11c,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&abPtr.px,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&abPtr.px,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&abPtr.px);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  pAVar4 = (A *)operator_new(8);
  B::B((B *)pAVar4);
  shared_ptr<A>::shared_ptr((shared_ptr<A> *)&gtest_ar_6.message_,pAVar4);
  local_151 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_150,"true","abPtr",&local_151,
             (shared_ptr<A> *)&gtest_ar_6.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x220,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_179 = true;
  local_17a = shared_ptr<A>::unique((shared_ptr<A> *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_178,"true","abPtr.unique()",&local_179,&local_17a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar2) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x221,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1a4 = 1;
  local_1b0 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_1a0,"1","abPtr.use_count()",&local_1a4,&local_1b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x222,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d8 = (void *)0x0;
  local_1e0 = shared_ptr<A>::get((shared_ptr<A> *)&gtest_ar_6.message_);
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)local_1d0,"(void*)__null","abPtr.get()",&local_1d8,&local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x223,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_204 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_200,"2","A::_mNbInstances",&local_204,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x224,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_22c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_228,"1","B::_mNbInstances",&local_22c,&B::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bPtr.px,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x225,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bPtr.px,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bPtr.px);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  this_01 = (B *)operator_new(8);
  B::B(this_01);
  shared_ptr<B>::shared_ptr((shared_ptr<B> *)&gtest_ar_12.message_,this_01);
  local_261 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<B>>
            ((EqHelper<false> *)local_260,"true","bPtr",&local_261,
             (shared_ptr<B> *)&gtest_ar_12.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_289 = true;
  local_28a = shared_ptr<B>::unique((shared_ptr<B> *)&gtest_ar_12.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_288,"true","bPtr.unique()",&local_289,&local_28a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x229,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2b4 = 1;
  local_2c0 = shared_ptr<B>::use_count((shared_ptr<B> *)&gtest_ar_12.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_2b0,"1","bPtr.use_count()",&local_2b4,&local_2c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_2e8 = (void *)0x0;
  local_2f0 = shared_ptr<B>::get((shared_ptr<B> *)&gtest_ar_12.message_);
  testing::internal::CmpHelperNE<void*,B*>
            ((internal *)local_2e0,"(void*)__null","bPtr.get()",&local_2e8,&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_314 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_310,"3","A::_mNbInstances",&local_314,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_33c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_338,"2","B::_mNbInstances",&local_33c,&B::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2Ptr.px,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2Ptr.px,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2Ptr.px);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  static_pointer_cast<A,B>((shared_ptr<B> *)&gtest_ar_18.message_);
  local_371 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_370,"true","a2Ptr",&local_371,
             (shared_ptr<A> *)&gtest_ar_18.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x231,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_399 = false;
  local_39a = shared_ptr<A>::unique((shared_ptr<A> *)&gtest_ar_18.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_398,"false","a2Ptr.unique()",&local_399,&local_39a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3c4 = 2;
  local_3d0 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar_18.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_3c0,"2","a2Ptr.use_count()",&local_3c4,&local_3d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x233,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3f8 = (void *)0x0;
  local_400 = shared_ptr<A>::get((shared_ptr<A> *)&gtest_ar_18.message_);
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)local_3f0,"(void*)__null","a2Ptr.get()",&local_3f8,&local_400);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_424 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_420,"3","A::_mNbInstances",&local_424,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x235,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_44c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_448,"2","B::_mNbInstances",&local_44c,&B::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar2) {
    testing::Message::Message(&local_458);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x236,pcVar3);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  this_00 = &gtest_ar_24.message_;
  shared_ptr<A>::shared_ptr((shared_ptr<A> *)this_00,(shared_ptr<A> *)&gtest_ar_18.message_);
  shared_ptr<A>::operator=((shared_ptr<A> *)&gtest_ar.message_,(shared_ptr<A> *)this_00);
  shared_ptr<A>::~shared_ptr((shared_ptr<A> *)this_00);
  local_484 = 3;
  local_490 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_480,"3","a0Ptr.use_count()",&local_484,&local_490);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  shared_ptr<A>::~shared_ptr((shared_ptr<A> *)&gtest_ar_18.message_);
  shared_ptr<B>::~shared_ptr((shared_ptr<B> *)&gtest_ar_12.message_);
  shared_ptr<A>::~shared_ptr((shared_ptr<A> *)&gtest_ar_6.message_);
  shared_ptr<A>::~shared_ptr((shared_ptr<A> *)&gtest_ar_1.message_);
  local_4b1 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_4b0,"true","a0Ptr",&local_4b1,
             (shared_ptr<A> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4d9 = true;
  local_4da = shared_ptr<A>::unique((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_4d8,"true","a0Ptr.unique()",&local_4d9,&local_4da);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar2) {
    testing::Message::Message(&local_4e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_504 = 1;
  local_510 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_500,"1","a0Ptr.use_count()",&local_504,&local_510);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar2) {
    testing::Message::Message(&local_518);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_538 = (void *)0x0;
  local_540 = shared_ptr<A>::get((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)local_530,"(void*)__null","a0Ptr.get()",&local_538,&local_540);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  local_564 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_560,"1","A::_mNbInstances",&local_564,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar2) {
    testing::Message::Message(&local_570);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x241,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  local_58c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_588,"1","B::_mNbInstances",&local_58c,&B::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x242,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  shared_ptr<A>::reset((shared_ptr<A> *)&gtest_ar.message_);
  local_5b1 = false;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<A>>
            ((EqHelper<false> *)local_5b0,"false","a0Ptr",&local_5b1,
             (shared_ptr<A> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar2) {
    testing::Message::Message(&local_5c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x246,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_5d9 = false;
  local_5da = shared_ptr<A>::unique((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_5d8,"false","a0Ptr.unique()",&local_5d9,&local_5da);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar2) {
    testing::Message::Message(&local_5e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x247,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  local_604 = 0;
  local_610 = shared_ptr<A>::use_count((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,long>
            (local_600,"0",(int *)"a0Ptr.use_count()",(long *)&local_604,&local_610);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar2) {
    testing::Message::Message(&local_618);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x248,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  local_638 = (void *)0x0;
  local_640 = shared_ptr<A>::get((shared_ptr<A> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<void*,A*>
            ((EqHelper<false> *)local_630,"(void*)__null","a0Ptr.get()",&local_638,&local_640);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar2) {
    testing::Message::Message(&local_648);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x249,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_664 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_660,"0",(int *)"A::_mNbInstances",&local_664,&A::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar2) {
    testing::Message::Message(&local_670);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  local_68c = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_688,"0",(int *)"B::_mNbInstances",&local_68c,&B::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar2) {
    testing::Message::Message(&local_698);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&this_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&this_local,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&this_local);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  shared_ptr<A>::~shared_ptr((shared_ptr<A> *)&gtest_ar.message_);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TEST(shared_ptr, stat_pointer_cast)
{
   shared_ptr<A> a0Ptr;
   EXPECT_EQ(false, a0Ptr);

   {
      shared_ptr<A> aPtr(new A);
      EXPECT_EQ(true, aPtr);
      EXPECT_EQ(true, aPtr.unique());
      EXPECT_EQ(1, aPtr.use_count());
      EXPECT_NE((void*)NULL, aPtr.get());
      EXPECT_EQ(1, A::_mNbInstances);

      shared_ptr<A> abPtr(new B);
      EXPECT_EQ(true, abPtr);
      EXPECT_EQ(true, abPtr.unique());
      EXPECT_EQ(1, abPtr.use_count());
      EXPECT_NE((void*)NULL, abPtr.get());
      EXPECT_EQ(2, A::_mNbInstances);
      EXPECT_EQ(1, B::_mNbInstances);

      shared_ptr<B> bPtr(new B);
      EXPECT_EQ(true, bPtr);
      EXPECT_EQ(true, bPtr.unique());
      EXPECT_EQ(1, bPtr.use_count());
      EXPECT_NE((void*)NULL, bPtr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // static cast
      shared_ptr<A> a2Ptr = static_pointer_cast<A>(bPtr);
      EXPECT_EQ(true, a2Ptr);
      EXPECT_EQ(false, a2Ptr.unique());
      EXPECT_EQ(2, a2Ptr.use_count());
      EXPECT_NE((void*)NULL, a2Ptr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // memorize a2Ptr
      a0Ptr = a2Ptr;
      EXPECT_EQ(3, a0Ptr.use_count());
   }
   // after release of the aPtr and bPtr : only abPtr converted to a2Ptr survived through a0Ptr
   EXPECT_EQ(true, a0Ptr);
   EXPECT_EQ(true, a0Ptr.unique());
   EXPECT_EQ(1, a0Ptr.use_count());
   EXPECT_NE((void*)NULL, a0Ptr.get());
   EXPECT_EQ(1, A::_mNbInstances);
   EXPECT_EQ(1, B::_mNbInstances);

   // release the last one
   a0Ptr.reset();
   EXPECT_EQ(false, a0Ptr);
   EXPECT_EQ(false, a0Ptr.unique());
   EXPECT_EQ(0,     a0Ptr.use_count());
   EXPECT_EQ((void*)NULL,  a0Ptr.get());
   EXPECT_EQ(0,     A::_mNbInstances);
   EXPECT_EQ(0,     B::_mNbInstances);
}